

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool-view.h
# Opt level: O3

bool __thiscall DReachabilityPropagatorReif::propagate(DReachabilityPropagatorReif *this)

{
  _Rb_tree_header *p_Var1;
  Tint *pTVar2;
  int iVar3;
  _Base_ptr p_Var4;
  TrailElem TStack_40;
  
  if ((sat.assigns.data[(uint)(this->b).v] == '\0') ||
     ((uint)(this->b).s * -2 + 1 != (int)sat.assigns.data[(uint)(this->b).v])) {
    return true;
  }
  iVar3 = (this->super_DReachabilityPropagator).in_nodes_tsize.v;
  if (iVar3 < (this->super_DReachabilityPropagator).in_nodes_size) {
    std::vector<int,_std::allocator<int>_>::resize
              (&(this->super_DReachabilityPropagator).in_nodes_list,(long)iVar3);
    (this->super_DReachabilityPropagator).in_nodes_size =
         (this->super_DReachabilityPropagator).in_nodes_tsize.v;
  }
  p_Var4 = (this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  p_Var1 = &(this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x11])(this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = (this->super_DReachabilityPropagator).last_state_e + (int)p_Var4[1]._M_color;
      TStack_40.x = pTVar2->v;
      TStack_40.sz = 4;
      TStack_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&TStack_40);
      pTVar2->v = 0;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->super_DReachabilityPropagator).rem_node._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  p_Var1 = &(this->super_DReachabilityPropagator).rem_node._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x13])(this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = (this->super_DReachabilityPropagator).last_state_n + (int)p_Var4[1]._M_color;
      TStack_40.x = pTVar2->v;
      TStack_40.sz = 4;
      TStack_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&TStack_40);
      pTVar2->v = 1;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  p_Var1 = &(this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x14])(this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = (this->super_DReachabilityPropagator).last_state_n + (int)p_Var4[1]._M_color;
      TStack_40.x = pTVar2->v;
      TStack_40.sz = 4;
      TStack_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&TStack_40);
      pTVar2->v = 0;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->super_DReachabilityPropagator).rem_edge._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  p_Var1 = &(this->super_DReachabilityPropagator).rem_edge._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x12])(this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = (this->super_DReachabilityPropagator).last_state_e + (int)p_Var4[1]._M_color;
      TStack_40.x = pTVar2->v;
      TStack_40.sz = 4;
      TStack_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&TStack_40);
      pTVar2->v = 1;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  if (((this->super_DReachabilityPropagator).rem_edge._M_t._M_impl.super__Rb_tree_header.
       _M_node_count != 0 ||
       (this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header.
       _M_node_count != 0) &&
     (iVar3 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x10])(this,1), (char)iVar3 == '\0')) {
    return false;
  }
  return true;
}

Assistant:

bool isFixed() const { return sat.assigns[v] != 0; }